

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_stream.c
# Opt level: O1

void tnt_stream_free(tnt_stream *s)

{
  if (s != (tnt_stream *)0x0) {
    if (s->free != (_func_void_tnt_stream_ptr *)0x0) {
      (*s->free)(s);
    }
    if (s->alloc != 0) {
      tnt_mem_free(s);
      return;
    }
  }
  return;
}

Assistant:

void tnt_stream_free(struct tnt_stream *s) {
	if (s == NULL)
		return;
	if (s->free)
		s->free(s);
	if (s->alloc)
		tnt_mem_free(s);
}